

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O3

void __thiscall
CoinSelection_SelectCoins_CoinSelectBnB_with_multiple_asset_Test::
~CoinSelection_SelectCoins_CoinSelectBnB_with_multiple_asset_Test
          (CoinSelection_SelectCoins_CoinSelectBnB_with_multiple_asset_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_CoinSelectBnB_with_multiple_asset)
{
  CoinSelection coin_select(true);
  // Same condition with "SelectCoins_SelectCoinsBnB"
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 99997900;
  map_target_amount[exp_dummy_asset_b.GetHex()] = 346495050;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetEffectiveFeeBaserate(2);
  option.SetFeeAsset(exp_dummy_asset_a);

  std::vector<Utxo> utxos;
  utxos.resize(kExtCoinSelectElementsTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectElementsTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), test_data.asset, nullptr,
        &(*ite));
    ++ite;
  }

  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = coin_select.SelectCoins(
      map_target_amount, utxos, exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 4);
  if (ret.size() == 4) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(346430050));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(750000));
    EXPECT_EQ(ret[2].amount, static_cast<int64_t>(85062500));
    EXPECT_EQ(ret[3].amount, static_cast<int64_t>(14938590));
  }
  EXPECT_EQ(map_select_value.size(), 2);
  if (map_select_value.size() == 2) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 100001090);
    EXPECT_EQ(map_select_value[exp_dummy_asset_b.GetHex()], 347180050);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 736);
  EXPECT_EQ(map_searched_bnb.size(), 2);
  if (map_searched_bnb.size() == 2) {
    EXPECT_TRUE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_b.GetHex()]);
  }
}